

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_context.h
# Opt level: O2

void __thiscall
google::protobuf::internal::ParseContext::ParseContext<std::__cxx11::string&>
          (ParseContext *this,long param_2,undefined8 *param_3,undefined8 *param_4)

{
  MessageFactory *pMVar1;
  char *pcVar2;
  string_view flat;
  
  (this->super_EpsCopyInputStream).patch_buffer_[0x18] = '\0';
  (this->super_EpsCopyInputStream).patch_buffer_[0x19] = '\0';
  (this->super_EpsCopyInputStream).patch_buffer_[0x1a] = '\0';
  (this->super_EpsCopyInputStream).patch_buffer_[0x1b] = '\0';
  (this->super_EpsCopyInputStream).patch_buffer_[0x1c] = '\0';
  (this->super_EpsCopyInputStream).patch_buffer_[0x1d] = '\0';
  (this->super_EpsCopyInputStream).patch_buffer_[0x1e] = '\0';
  (this->super_EpsCopyInputStream).patch_buffer_[0x1f] = '\0';
  (this->super_EpsCopyInputStream).aliasing_ = 0;
  (this->super_EpsCopyInputStream).patch_buffer_[8] = '\0';
  (this->super_EpsCopyInputStream).patch_buffer_[9] = '\0';
  (this->super_EpsCopyInputStream).patch_buffer_[10] = '\0';
  (this->super_EpsCopyInputStream).patch_buffer_[0xb] = '\0';
  (this->super_EpsCopyInputStream).patch_buffer_[0xc] = '\0';
  (this->super_EpsCopyInputStream).patch_buffer_[0xd] = '\0';
  (this->super_EpsCopyInputStream).patch_buffer_[0xe] = '\0';
  (this->super_EpsCopyInputStream).patch_buffer_[0xf] = '\0';
  (this->super_EpsCopyInputStream).patch_buffer_[0x10] = '\0';
  (this->super_EpsCopyInputStream).patch_buffer_[0x11] = '\0';
  (this->super_EpsCopyInputStream).patch_buffer_[0x12] = '\0';
  (this->super_EpsCopyInputStream).patch_buffer_[0x13] = '\0';
  (this->super_EpsCopyInputStream).patch_buffer_[0x14] = '\0';
  (this->super_EpsCopyInputStream).patch_buffer_[0x15] = '\0';
  (this->super_EpsCopyInputStream).patch_buffer_[0x16] = '\0';
  (this->super_EpsCopyInputStream).patch_buffer_[0x17] = '\0';
  (this->super_EpsCopyInputStream).zcis_ = (ZeroCopyInputStream *)0x0;
  (this->super_EpsCopyInputStream).patch_buffer_[0] = '\0';
  (this->super_EpsCopyInputStream).patch_buffer_[1] = '\0';
  (this->super_EpsCopyInputStream).patch_buffer_[2] = '\0';
  (this->super_EpsCopyInputStream).patch_buffer_[3] = '\0';
  (this->super_EpsCopyInputStream).patch_buffer_[4] = '\0';
  (this->super_EpsCopyInputStream).patch_buffer_[5] = '\0';
  (this->super_EpsCopyInputStream).patch_buffer_[6] = '\0';
  (this->super_EpsCopyInputStream).patch_buffer_[7] = '\0';
  (this->super_EpsCopyInputStream).last_tag_minus_1_ = 0;
  (this->super_EpsCopyInputStream).overall_limit_ = 0x7fffffff;
  this->depth_ = *(int *)(param_2 + 0x58);
  this->group_depth_ = -0x80000000;
  pMVar1 = *(MessageFactory **)(param_2 + 0x68);
  (this->data_).pool = *(DescriptorPool **)(param_2 + 0x60);
  (this->data_).factory = pMVar1;
  flat._M_str = (char *)*param_4;
  flat._M_len = param_4[1];
  pcVar2 = EpsCopyInputStream::InitFrom(&this->super_EpsCopyInputStream,flat);
  *param_3 = pcVar2;
  return;
}

Assistant:

ParseContext(Spawn, const ParseContext& ctx, const char** start, T&&... args)
      : EpsCopyInputStream(false),
        depth_(ctx.depth_),
        data_(ctx.data_)
  {
    *start = InitFrom(std::forward<T>(args)...);
  }